

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O1

AST * parse_finish_continue_statement(Translation_Data *translation_data)

{
  char cVar1;
  AST *error;
  AST_Error *pAVar2;
  
  error = (AST *)malloc(4);
  error->type = ST_CONTINUE;
  cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
  if (cVar1 != '\0') {
    return error;
  }
  push_translation_error(" \';\' expected",translation_data);
  pAVar2 = get_error_tree(error);
  return (AST *)pAVar2;
}

Assistant:

struct AST* parse_finish_continue_statement(struct Translation_Data* translation_data)
{
	struct AST *hold;
	hold=malloc(sizeof(struct AST));
	hold->type=ST_CONTINUE;
	if(get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		return hold;
	}else
	{
		push_translation_error(" ';' expected",translation_data);
		return (struct AST*)get_error_tree(hold);
	}
}